

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

void anon_unknown.dwarf_45453::replace(string *str,string *find,string *replace)

{
  ulong uVar1;
  string *psVar2;
  ulong in_RSI;
  string *in_RDI;
  size_type pos;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find(in_RDI,in_RSI);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)in_RDI,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  return;
}

Assistant:

void replace(
    std::string& str,
    const std::string& find,
    const std::string& replace) {
  std::string::size_type pos = 0u;
  while ((pos = str.find(find, pos)) != std::string::npos) {
    str.replace(pos, find.length(), replace);
    pos += replace.length();
  }
}